

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O0

FT_Error cff_charset_compute_cids(CFF_Charset charset,FT_UInt num_glyphs,FT_Memory memory)

{
  FT_UShort *pFVar1;
  ushort local_2a;
  uint local_28;
  FT_Error FStack_24;
  FT_UShort max_cid;
  FT_UInt i;
  FT_Error error;
  FT_Memory memory_local;
  CFF_Charset pCStack_10;
  FT_UInt num_glyphs_local;
  CFF_Charset charset_local;
  
  FStack_24 = 0;
  local_2a = 0;
  if (charset->max_cid == 0) {
    for (local_28 = 0; local_28 < num_glyphs; local_28 = local_28 + 1) {
      if (local_2a < charset->sids[local_28]) {
        local_2a = charset->sids[local_28];
      }
    }
    _i = memory;
    memory_local._4_4_ = num_glyphs;
    pCStack_10 = charset;
    pFVar1 = (FT_UShort *)
             ft_mem_realloc(memory,2,0,(ulong)local_2a + 1,(void *)0x0,&stack0xffffffffffffffdc);
    pCStack_10->cids = pFVar1;
    local_28 = memory_local._4_4_;
    if (FStack_24 == 0) {
      while (local_28 = local_28 - 1, local_28 < memory_local._4_4_) {
        pCStack_10->cids[pCStack_10->sids[local_28]] = (FT_UShort)local_28;
      }
      pCStack_10->max_cid = (uint)local_2a;
      pCStack_10->num_glyphs = memory_local._4_4_;
    }
  }
  return FStack_24;
}

Assistant:

static FT_Error
  cff_charset_compute_cids( CFF_Charset  charset,
                            FT_UInt      num_glyphs,
                            FT_Memory    memory )
  {
    FT_Error   error   = FT_Err_Ok;
    FT_UInt    i;
    FT_UShort  max_cid = 0;


    if ( charset->max_cid > 0 )
      goto Exit;

    for ( i = 0; i < num_glyphs; i++ )
    {
      if ( charset->sids[i] > max_cid )
        max_cid = charset->sids[i];
    }

    if ( FT_NEW_ARRAY( charset->cids, (FT_ULong)max_cid + 1 ) )
      goto Exit;

    /* When multiple GIDs map to the same CID, we choose the lowest */
    /* GID.  This is not described in any spec, but it matches the  */
    /* behaviour of recent Acroread versions.  The loop stops when  */
    /* the unsigned index wraps around after reaching zero.         */
    for ( i = num_glyphs - 1; i < num_glyphs; i-- )
      charset->cids[charset->sids[i]] = (FT_UShort)i;

    charset->max_cid    = max_cid;
    charset->num_glyphs = num_glyphs;

  Exit:
    return error;
  }